

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSizeTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles3::Functional::TextureCubeSizeCase::testFace(TextureCubeSizeCase *this,CubeFace face)

{
  ostringstream *this_00;
  TextureFormat log;
  RenderContext *context;
  TextureCube *pTVar1;
  pointer texCoord_00;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  RGBA threshold;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  RandomViewport viewport;
  vector<float,_std::allocator<float>_> texCoord;
  Surface referenceFrame;
  Surface renderedFrame;
  TextureCubeView local_248;
  Sampler sampler;
  SurfaceAccess local_1d0;
  undefined1 local_1b0 [384];
  long lVar5;
  
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  log = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  dVar4 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar3),0x80,0x80,dVar4 + face);
  tcu::Surface::Surface(&renderedFrame,viewport.width,viewport.height);
  tcu::Surface::Surface(&referenceFrame,viewport.width,viewport.height);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  local_1b0._0_4_ =
       tcu::PixelFormat::getColorThreshold((PixelFormat *)(CONCAT44(extraout_var_01,iVar3) + 8));
  sampler.wrapS = 0x7070707;
  threshold = tcu::operator+((RGBA *)local_1b0,(RGBA *)&sampler);
  dVar4 = 0x2601;
  if (this->m_useMipmaps != false) {
    dVar4 = 0x2700;
  }
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  glu::TextureTestUtil::computeQuadTexCoordCube(&texCoord,face);
  this_00 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(this_00);
  tcu::operator<<((ostream *)this_00,face);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  (**(code **)(lVar5 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  (**(code **)(lVar5 + 8))(0x84c0);
  (**(code **)(lVar5 + 0xb8))(0x8513,this->m_texture->m_glTexture);
  (**(code **)(lVar5 + 0x1360))(0x8513,0x2802,0x812f);
  (**(code **)(lVar5 + 0x1360))(0x8513,0x2803,0x812f);
  (**(code **)(lVar5 + 0x1360))(0x8513,0x2801,dVar4);
  (**(code **)(lVar5 + 0x1360))(0x8513,0x2800,0x2600);
  err = (**(code **)(lVar5 + 0x800))();
  glu::checkError(err,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureSizeTests.cpp"
                  ,0x128);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,
             texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,TEXTURETYPE_CUBE);
  context = this->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)local_1b0,&renderedFrame);
  glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)local_1b0);
  glu::mapGLSampler(&sampler,0x812f,0x812f,dVar4,0x2600);
  sampler.seamlessCubeMap = true;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  tcu::SurfaceAccess::SurfaceAccess
            (&local_1d0,&referenceFrame,(PixelFormat *)(CONCAT44(extraout_var_02,iVar3) + 8));
  texCoord_00 = texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
  pTVar1 = this->m_texture;
  local_248.m_levels[5] = (pTVar1->m_refTexture).m_view.m_levels[5];
  local_248.m_numLevels = (pTVar1->m_refTexture).m_view.m_numLevels;
  local_248._4_4_ = *(undefined4 *)&(pTVar1->m_refTexture).m_view.field_0x4;
  local_248.m_levels[0] = (pTVar1->m_refTexture).m_view.m_levels[0];
  local_248.m_levels[1] = (pTVar1->m_refTexture).m_view.m_levels[1];
  local_248.m_levels[2] = (pTVar1->m_refTexture).m_view.m_levels[2];
  local_248.m_levels[3] = (pTVar1->m_refTexture).m_view.m_levels[3];
  local_248.m_levels[4] = (pTVar1->m_refTexture).m_view.m_levels[4];
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_1b0,TEXTURETYPE_CUBE,&sampler,LODMODE_EXACT);
  glu::TextureTestUtil::sampleTexture
            (&local_1d0,&local_248,texCoord_00,(ReferenceParams *)local_1b0);
  bVar2 = glu::TextureTestUtil::compareImages
                    ((TestLog *)log,&referenceFrame,&renderedFrame,threshold);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
  tcu::Surface::~Surface(&referenceFrame);
  tcu::Surface::~Surface(&renderedFrame);
  return bVar2;
}

Assistant:

bool TextureCubeSizeCase::testFace (tcu::CubeFace face)
{
	const glw::Functions&	gl				= m_renderCtx.getFunctions();
	TestLog&				log				= m_testCtx.getLog();
	RandomViewport			viewport		(m_renderCtx.getRenderTarget(), 128, 128, deStringHash(getName())+(deUint32)face);
	tcu::Surface			renderedFrame	(viewport.width, viewport.height);
	tcu::Surface			referenceFrame	(viewport.width, viewport.height);
	tcu::RGBA				threshold		= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(7,7,7,7);
	deUint32				wrapS			= GL_CLAMP_TO_EDGE;
	deUint32				wrapT			= GL_CLAMP_TO_EDGE;
	// Do not minify with GL_NEAREST. A large POT texture with a small POT render target will produce
	// indeterminate results.
	deUint32				minFilter		= m_useMipmaps ? GL_NEAREST_MIPMAP_NEAREST : GL_LINEAR;
	deUint32				magFilter		= GL_NEAREST;
	vector<float>			texCoord;

	computeQuadTexCoordCube(texCoord, face);

	// \todo [2011-10-28 pyry] Image set name / section?
	log << TestLog::Message << face << TestLog::EndMessage;

	// Setup base viewport.
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Bind to unit 0.
	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_texture->getGLTexture());

	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S, wrapS);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T, wrapT);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, minFilter);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, magFilter);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Set texturing state");

	m_renderer.renderQuad(0, &texCoord[0], TEXTURETYPE_CUBE);
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

	// Compute reference.
	Sampler sampler = mapGLSampler(wrapS, wrapT, minFilter, magFilter);
	sampler.seamlessCubeMap = true;
	sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat()), m_texture->getRefTexture(), &texCoord[0], ReferenceParams(TEXTURETYPE_CUBE, sampler));

	// Compare and log.
	return compareImages(log, referenceFrame, renderedFrame, threshold);
}